

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_69(QPDF *pdf,char *arg2)

{
  ulong uVar1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__x;
  size_type sVar2;
  reference pvVar3;
  char *pcVar4;
  QPDFWriter local_f8 [8];
  QPDFWriter w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string outname;
  QPDF local_40 [8];
  QPDF out;
  size_t i;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> pages;
  char *arg2_local;
  QPDF *pdf_local;
  
  pages.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)arg2;
  QPDF::setImmediateCopyFrom(SUB81(pdf,0));
  __x = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&i,__x);
  _out = 0;
  while( true ) {
    uVar1 = _out;
    sVar2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                      ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&i);
    if (sVar2 <= uVar1) break;
    QPDF::QPDF(local_40);
    QPDF::emptyPDF();
    pvVar3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                       ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&i,_out);
    QPDFObjectHandle::QPDFObjectHandle
              ((QPDFObjectHandle *)(&outname.field_2._M_allocated_capacity + 1),pvVar3);
    QPDF::addPage((QPDFObjectHandle *)local_40,
                  SUB81((QPDFObjectHandle *)(&outname.field_2._M_allocated_capacity + 1),0));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)((long)&outname.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"auto-",&local_c1);
    QUtil::uint_to_string_abi_cxx11_((ulonglong)&local_e8,(int)_out);
    std::operator+(&local_a0,&local_c0,&local_e8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   &local_a0,".pdf");
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    QPDFWriter::QPDFWriter(local_f8,local_40,pcVar4);
    QPDFWriter::setStaticID(SUB81(local_f8,0));
    QPDFWriter::write();
    QPDFWriter::~QPDFWriter(local_f8);
    std::__cxx11::string::~string((string *)local_80);
    QPDF::~QPDF(local_40);
    _out = _out + 1;
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&i);
  return;
}

Assistant:

static void
test_69(QPDF& pdf, char const* arg2)
{
    pdf.setImmediateCopyFrom(true);
    auto pages = pdf.getAllPages();
    for (size_t i = 0; i < pages.size(); ++i) {
        QPDF out;
        out.emptyPDF();
        out.addPage(pages.at(i), false);
        std::string outname = std::string("auto-") + QUtil::uint_to_string(i) + ".pdf";
        QPDFWriter w(out, outname.c_str());
        w.setStaticID(true);
        w.write();
    }
}